

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglshaderprogram.cpp
# Opt level: O0

void __thiscall
QOpenGLShaderProgram::setUniformValue(QOpenGLShaderProgram *this,int location,QTransform *value)

{
  QOpenGLShaderProgramPrivate *value_00;
  QTransform *in_RDX;
  int in_ESI;
  QOpenGLFunctions *in_RDI;
  long in_FS_OFFSET;
  qreal qVar1;
  QOpenGLShaderProgramPrivate *d;
  GLfloat mat [3] [3];
  GLsizei in_stack_ffffffffffffffb8;
  float local_38;
  float local_34;
  float local_30;
  float local_2c;
  float local_28;
  float local_24;
  float local_20;
  float local_1c;
  float local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  value_00 = d_func((QOpenGLShaderProgram *)0x17771e);
  if (in_ESI != -1) {
    memset(&local_38,0xff,0x24);
    qVar1 = QTransform::m11(in_RDX);
    local_38 = (float)qVar1;
    qVar1 = QTransform::m12(in_RDX);
    local_34 = (float)qVar1;
    qVar1 = QTransform::m13(in_RDX);
    local_30 = (float)qVar1;
    qVar1 = QTransform::m21(in_RDX);
    local_2c = (float)qVar1;
    qVar1 = QTransform::m22(in_RDX);
    local_28 = (float)qVar1;
    qVar1 = QTransform::m23(in_RDX);
    local_24 = (float)qVar1;
    qVar1 = QTransform::m31(in_RDX);
    local_20 = (float)qVar1;
    qVar1 = QTransform::m32(in_RDX);
    local_1c = (float)qVar1;
    qVar1 = QTransform::m33(in_RDX);
    local_18 = (float)qVar1;
    QOpenGLFunctions::glUniformMatrix3fv
              (in_RDI,in_ESI,in_stack_ffffffffffffffb8,(GLboolean)((ulong)in_RDX >> 0x38),
               (GLfloat *)value_00);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QOpenGLShaderProgram::setUniformValue(int location, const QTransform& value)
{
    Q_D(QOpenGLShaderProgram);
    Q_UNUSED(d);
    if (location != -1) {
        GLfloat mat[3][3] = {
            {GLfloat(value.m11()), GLfloat(value.m12()), GLfloat(value.m13())},
            {GLfloat(value.m21()), GLfloat(value.m22()), GLfloat(value.m23())},
            {GLfloat(value.m31()), GLfloat(value.m32()), GLfloat(value.m33())}
        };
        d->glfuncs->glUniformMatrix3fv(location, 1, GL_FALSE, mat[0]);
    }
}